

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *param_1)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  ulong uVar9;
  int k;
  int iVar10;
  uint uVar11;
  uint _c;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  undefined4 *puVar15;
  int k_3;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint _w;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int k_2;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined4 *puVar32;
  long lVar33;
  undefined4 *puVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  
  p_Var4 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var4) != 0) {
    return 0;
  }
  uVar2 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
  lVar22 = (long)(int)uVar2;
  uVar37 = (ulong)uVar2;
  uVar9 = (long)*(int *)(&this->field_0xf0 + (long)p_Var4) / (long)(int)uVar2;
  uVar3 = *(uint *)(&this->field_0xd0 + (long)p_Var4);
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)(int)uVar3;
  uVar11 = (uint)uVar9;
  uVar16 = uVar11;
  if ((long)(int)uVar3 < 4) {
    if ((int)uVar3 < 2) {
      if (3 < (int)uVar11) {
        iVar17 = uVar2 * 4;
        iVar25 = (uVar11 & 1) + (int)((uVar9 & 0xffffffff) >> 2) + (uint)((uVar11 >> 1 & 1) != 0);
        uVar16 = uVar3;
        goto LAB_00525649;
      }
      _c = uVar3;
      _w = uVar2;
      if (1 < (int)uVar11) {
        uVar16 = (uVar11 & 1) + 1;
        _w = uVar2 * 2;
      }
    }
    else {
      if (3 < (int)uVar11) {
        iVar25 = (uVar11 & 1) + (int)((uVar9 & 0xffffffff) >> 2) + (uint)((uVar11 >> 1 & 1) != 0);
        iVar17 = uVar2 * 8;
        uVar16 = (uVar3 & 1) + 1;
LAB_00525649:
        Mat::create(&this->weight_data_tm,iVar17,iVar25,uVar16,4,(Allocator *)0x0);
        goto LAB_005256a5;
      }
      if ((int)uVar11 < 2) {
        _w = uVar2 * 2;
      }
      else {
        _w = uVar2 * 4;
        uVar16 = (uVar11 & 1) + 1;
      }
      _c = (uVar3 & 1) + 1;
    }
  }
  else {
    if ((int)uVar11 < 4) {
      if ((int)uVar11 < 2) {
        _w = uVar2 * 4;
      }
      else {
        _w = uVar2 * 8;
        uVar16 = (uVar11 & 1) + 1;
      }
    }
    else {
      _w = uVar2 << 4;
      uVar16 = (uVar11 & 1) + ((uint)(uVar9 >> 2) & 0x3fffffff) + (uint)((uVar11 >> 1 & 1) != 0);
    }
    _c = (uVar3 & 1) + (uVar3 >> 2) + (uint)((uVar3 >> 1 & 1) != 0);
  }
  Mat::create(&this->weight_data_tm,_w,uVar16,_c,4,(Allocator *)0x0);
LAB_005256a5:
  uVar23 = 0;
  if (3 < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    iVar21 = uVar11 * uVar2;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    pvVar8 = (this->weight_data_tm).data;
    iVar10 = uVar2 * uVar11;
    iVar25 = iVar10 * 4;
    lVar18 = uVar37 * 0x10;
    lVar1 = lVar22 * 4;
    iVar17 = iVar10 * 3;
    iVar10 = iVar10 * 2;
    iVar28 = 0;
    uVar31 = 0;
    do {
      puVar32 = (undefined4 *)((uVar31 >> 2) * sVar6 * sVar7 + (long)pvVar8);
      if ((int)uVar11 < 4) {
        uVar23 = 0;
      }
      else {
        lVar36 = lVar5 + (long)iVar28 * 4;
        lVar24 = lVar5 + (long)iVar21 * 4;
        lVar41 = lVar5 + (long)iVar10 * 4;
        lVar29 = lVar5 + (long)iVar17 * 4;
        uVar12 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar19 = lVar24;
            lVar26 = lVar29;
            lVar35 = lVar36;
            lVar38 = lVar41;
            do {
              puVar34 = puVar32;
              lVar33 = 0;
              lVar40 = 0;
              do {
                *(undefined4 *)((long)puVar34 + lVar40) = *(undefined4 *)(lVar35 + lVar33);
                *(undefined4 *)((long)puVar34 + lVar40 + 4) = *(undefined4 *)(lVar19 + lVar33);
                *(undefined4 *)((long)puVar34 + lVar40 + 8) = *(undefined4 *)(lVar38 + lVar33);
                *(undefined4 *)((long)puVar34 + lVar40 + 0xc) = *(undefined4 *)(lVar26 + lVar33);
                lVar40 = lVar40 + 0x10;
                lVar33 = lVar33 + lVar1;
              } while ((int)lVar40 != 0x40);
              uVar23 = uVar23 + 1;
              lVar35 = lVar35 + 4;
              lVar19 = lVar19 + 4;
              lVar38 = lVar38 + 4;
              lVar26 = lVar26 + 4;
              puVar32 = (undefined4 *)(lVar40 + (long)puVar34);
            } while (uVar23 != uVar37);
            puVar32 = (undefined4 *)((long)puVar34 + lVar40);
          }
          uVar23 = uVar12 + 4;
          lVar19 = uVar12 + 7;
          lVar36 = lVar36 + lVar18;
          lVar24 = lVar24 + lVar18;
          lVar41 = lVar41 + lVar18;
          lVar29 = lVar29 + lVar18;
          uVar12 = uVar23;
        } while (lVar19 < (int)uVar11);
      }
      lVar29 = (long)iVar17 * 4;
      lVar36 = (long)iVar10 * 4;
      lVar24 = (long)iVar21 * 4;
      lVar41 = (long)iVar28 * 4;
      if ((int)((uint)uVar23 | 1) < (int)uVar11) {
        lVar19 = lVar1 * (uVar23 & 0xffffffff);
        lVar26 = 0;
        uVar12 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar35 = lVar26;
            do {
              puVar34 = puVar32;
              lVar33 = 0;
              lVar38 = lVar35;
              do {
                *(undefined4 *)((long)puVar34 + lVar33) =
                     *(undefined4 *)(lVar41 + lVar19 + lVar5 + lVar38);
                *(undefined4 *)((long)puVar34 + lVar33 + 4) =
                     *(undefined4 *)(lVar19 + lVar24 + lVar5 + lVar38);
                *(undefined4 *)((long)puVar34 + lVar33 + 8) =
                     *(undefined4 *)(lVar19 + lVar36 + lVar5 + lVar38);
                *(undefined4 *)((long)puVar34 + lVar33 + 0xc) =
                     *(undefined4 *)(lVar19 + lVar29 + lVar5 + lVar38);
                lVar33 = lVar33 + 0x10;
                lVar38 = lVar38 + lVar1;
              } while ((int)lVar33 == 0x10);
              uVar23 = uVar23 + 1;
              lVar35 = lVar35 + 4;
              puVar32 = (undefined4 *)(lVar33 + (long)puVar34);
            } while (uVar23 != uVar37);
            puVar32 = (undefined4 *)((long)puVar34 + lVar33);
          }
          uVar23 = uVar12 + 2;
          lVar35 = uVar12 + 3;
          lVar26 = lVar26 + lVar22 * 8;
          uVar12 = uVar23;
        } while (lVar35 < (int)uVar11);
      }
      if ((int)uVar23 < (int)uVar11) {
        uVar23 = uVar23 & 0xffffffff;
        lVar19 = lVar1 * uVar23;
        lVar29 = lVar29 + lVar19 + lVar5;
        lVar36 = lVar36 + lVar19 + lVar5;
        lVar24 = lVar24 + lVar19 + lVar5;
        lVar41 = lVar19 + lVar41 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar19 = 0;
            puVar34 = puVar32;
            do {
              puVar15 = puVar34;
              puVar34 = puVar32 + lVar19;
              *puVar34 = *(undefined4 *)(lVar41 + lVar19);
              puVar34[1] = *(undefined4 *)(lVar24 + lVar19);
              puVar34[2] = *(undefined4 *)(lVar36 + lVar19);
              puVar34[3] = *(undefined4 *)(lVar29 + lVar19);
              lVar19 = lVar19 + 4;
              puVar34 = puVar34 + 4;
            } while (uVar37 * 4 != lVar19);
            puVar32 = puVar15 + 4;
          }
          uVar23 = uVar23 + 1;
          lVar29 = lVar29 + lVar1;
          lVar36 = lVar36 + lVar1;
          lVar24 = lVar24 + lVar1;
          lVar41 = lVar41 + lVar1;
        } while (uVar23 != (uVar9 & 0xffffffff));
      }
      uVar23 = uVar31 + 4;
      uVar12 = uVar31 + 7;
      iVar28 = iVar28 + iVar25;
      iVar21 = iVar21 + iVar25;
      iVar10 = iVar10 + iVar25;
      iVar17 = iVar17 + iVar25;
      uVar31 = uVar23;
    } while (uVar12 < uVar3);
  }
  uVar16 = (uint)uVar23 | 1;
  if ((int)uVar16 < (int)uVar3) {
    lVar24 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar8 = (this->weight_data_tm).data;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    lVar1 = lVar24 + (long)(int)(uVar2 * 3) * 4;
    iVar10 = uVar16 * uVar2 * uVar11;
    iVar25 = uVar2 * uVar11 * 2;
    lVar41 = uVar37 * 0x10;
    lVar5 = lVar24 + (long)(int)(uVar2 * 2) * 4;
    lVar36 = lVar22 * 4;
    lVar18 = lVar24 + lVar22 * 4;
    iVar17 = uVar2 * uVar11 * (uint)uVar23;
    uVar31 = uVar23 & 0xffffffff;
    do {
      lVar19 = (long)iVar10;
      lVar29 = (long)iVar17;
      puVar32 = (undefined4 *)
                ((ulong)(((uint)(uVar31 >> 2) & 0x3fffffff) + (uint)(((uint)uVar31 >> 1 & 1) != 0))
                 * sVar6 * sVar7 + (long)pvVar8);
      if ((int)uVar11 < 4) {
        uVar23 = 0;
      }
      else {
        lVar26 = lVar1 + lVar19 * 4;
        lVar35 = lVar5 + lVar19 * 4;
        lVar38 = lVar18 + lVar19 * 4;
        lVar33 = lVar24 + lVar19 * 4;
        lVar40 = lVar1 + lVar29 * 4;
        lVar30 = lVar5 + lVar29 * 4;
        lVar20 = lVar18 + lVar29 * 4;
        lVar27 = lVar24 + lVar29 * 4;
        uVar12 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar39 = 0;
            puVar34 = puVar32;
            do {
              puVar15 = puVar34;
              puVar34 = puVar32 + lVar39 * 2;
              *puVar34 = *(undefined4 *)(lVar27 + lVar39);
              puVar34[1] = *(undefined4 *)(lVar20 + lVar39);
              puVar34[2] = *(undefined4 *)(lVar30 + lVar39);
              puVar34[3] = *(undefined4 *)(lVar40 + lVar39);
              puVar34[4] = *(undefined4 *)(lVar33 + lVar39);
              puVar34[5] = *(undefined4 *)(lVar38 + lVar39);
              puVar34[6] = *(undefined4 *)(lVar35 + lVar39);
              puVar34[7] = *(undefined4 *)(lVar26 + lVar39);
              lVar39 = lVar39 + 4;
              puVar34 = puVar34 + 8;
            } while (uVar37 * 4 != lVar39);
            puVar32 = puVar15 + 8;
          }
          uVar23 = uVar12 + 4;
          lVar39 = uVar12 + 7;
          lVar26 = lVar26 + lVar41;
          lVar35 = lVar35 + lVar41;
          lVar38 = lVar38 + lVar41;
          lVar33 = lVar33 + lVar41;
          lVar40 = lVar40 + lVar41;
          lVar30 = lVar30 + lVar41;
          lVar20 = lVar20 + lVar41;
          lVar27 = lVar27 + lVar41;
          uVar12 = uVar23;
        } while (lVar39 < (int)uVar11);
      }
      if ((int)((uint)uVar23 | 1) < (int)uVar11) {
        lVar26 = lVar36 * (uVar23 & 0xffffffff);
        lVar35 = lVar26 + lVar19 * 4 + lVar24;
        lVar26 = lVar26 + lVar29 * 4 + lVar24;
        uVar12 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar38 = lVar26;
            lVar33 = lVar35;
            do {
              puVar34 = puVar32;
              lVar30 = 0;
              lVar40 = 0;
              do {
                *(undefined4 *)((long)puVar34 + lVar40) = *(undefined4 *)(lVar38 + lVar30);
                *(undefined4 *)((long)puVar34 + lVar40 + 4) = *(undefined4 *)(lVar33 + lVar30);
                lVar40 = lVar40 + 8;
                lVar30 = lVar30 + lVar36;
              } while ((int)lVar40 == 8);
              uVar23 = uVar23 + 1;
              lVar33 = lVar33 + 4;
              lVar38 = lVar38 + 4;
              puVar32 = (undefined4 *)((long)puVar34 + lVar40);
            } while (uVar23 != uVar37);
            puVar32 = (undefined4 *)((long)puVar34 + lVar40);
          }
          uVar23 = uVar12 + 2;
          lVar38 = uVar12 + 3;
          lVar35 = lVar35 + lVar22 * 8;
          lVar26 = lVar26 + lVar22 * 8;
          uVar12 = uVar23;
        } while (lVar38 < (int)uVar11);
      }
      if ((int)uVar23 < (int)uVar11) {
        uVar23 = uVar23 & 0xffffffff;
        lVar19 = lVar19 * 4 + lVar36 * uVar23 + lVar24;
        lVar29 = lVar36 * uVar23 + lVar29 * 4 + lVar24;
        do {
          if (0 < (int)uVar2) {
            uVar12 = 0;
            do {
              *puVar32 = *(undefined4 *)(lVar29 + uVar12 * 4);
              puVar32[1] = *(undefined4 *)(lVar19 + uVar12 * 4);
              puVar32 = puVar32 + 2;
              uVar12 = uVar12 + 1;
            } while (uVar37 != uVar12);
          }
          uVar23 = uVar23 + 1;
          lVar19 = lVar19 + lVar36;
          lVar29 = lVar29 + lVar36;
        } while (uVar23 != (uVar9 & 0xffffffff));
      }
      uVar23 = uVar31 + 2;
      lVar29 = uVar31 + 3;
      iVar10 = iVar10 + iVar25;
      iVar17 = iVar17 + iVar25;
      uVar31 = uVar23;
    } while (lVar29 < (int)uVar3);
  }
  if ((int)uVar23 < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar8 = (this->weight_data_tm).data;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    uVar31 = uVar23 & 0xffffffff;
    iVar25 = uVar2 * uVar11 * (int)uVar23;
    lVar1 = lVar22 * 4;
    do {
      pvVar13 = (void *)((ulong)(((uint)uVar31 & 1) + ((uint)(uVar31 >> 2) & 0x3fffffff) +
                                (uint)(((uint)uVar31 >> 1 & 1) != 0)) * sVar6 * sVar7 + (long)pvVar8
                        );
      if ((int)uVar11 < 4) {
        uVar23 = 0;
      }
      else {
        puVar32 = (undefined4 *)(lVar5 + (long)iVar25 * 4);
        uVar12 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            puVar34 = puVar32;
            do {
              pvVar14 = pvVar13;
              lVar18 = 0;
              puVar15 = puVar34;
              do {
                *(undefined4 *)((long)pvVar14 + lVar18) = *puVar15;
                lVar18 = lVar18 + 4;
                puVar15 = puVar15 + lVar22;
              } while ((int)lVar18 != 0x10);
              uVar23 = uVar23 + 1;
              puVar34 = puVar34 + 1;
              pvVar13 = (void *)((long)pvVar14 + lVar18);
            } while (uVar23 != uVar37);
            pvVar13 = (void *)((long)pvVar14 + lVar18);
          }
          uVar23 = uVar12 + 4;
          lVar18 = uVar12 + 7;
          puVar32 = puVar32 + uVar37 * 4;
          uVar12 = uVar23;
        } while (lVar18 < (int)uVar11);
      }
      lVar18 = (long)iVar25 * 4;
      if ((int)((uint)uVar23 | 1) < (int)uVar11) {
        puVar32 = (undefined4 *)(lVar1 * (uVar23 & 0xffffffff) + lVar18 + lVar5);
        uVar12 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            puVar34 = puVar32;
            do {
              pvVar14 = pvVar13;
              lVar36 = 0;
              puVar15 = puVar34;
              do {
                *(undefined4 *)((long)pvVar14 + lVar36) = *puVar15;
                lVar36 = lVar36 + 4;
                puVar15 = puVar15 + lVar22;
              } while ((int)lVar36 == 4);
              uVar23 = uVar23 + 1;
              puVar34 = puVar34 + 1;
              pvVar13 = (void *)((long)pvVar14 + lVar36);
            } while (uVar23 != uVar37);
            pvVar13 = (void *)((long)pvVar14 + lVar36);
          }
          uVar23 = uVar12 + 2;
          lVar36 = uVar12 + 3;
          puVar32 = puVar32 + lVar22 * 2;
          uVar12 = uVar23;
        } while (lVar36 < (int)uVar11);
      }
      if ((int)uVar23 < (int)uVar11) {
        uVar23 = uVar23 & 0xffffffff;
        lVar18 = lVar1 * uVar23 + lVar18 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar36 = 0;
            do {
              *(undefined4 *)((long)pvVar13 + lVar36) = *(undefined4 *)(lVar18 + lVar36);
              lVar36 = lVar36 + 4;
            } while (uVar37 * 4 - lVar36 != 0);
            pvVar13 = (void *)((long)pvVar13 + lVar36);
          }
          uVar23 = uVar23 + 1;
          lVar18 = lVar18 + lVar1;
        } while (uVar23 != (uVar9 & 0xffffffff));
      }
      uVar31 = uVar31 + 1;
      iVar25 = iVar25 + uVar2 * uVar11;
    } while (uVar31 != uVar3);
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}